

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  int *piVar1;
  pointer pBVar2;
  MortonPrimitive *pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pMVar6;
  pointer pLVar7;
  int pass;
  uint uVar8;
  BVHBuildNode *pBVar9;
  pointer pLVar10;
  MortonPrimitive *pMVar11;
  pointer *ppMVar12;
  int iVar13;
  MortonPrimitive *pMVar14;
  _Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *p_Var15;
  int i;
  long lVar16;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  ulong uVar17;
  int iVar18;
  pointer pBVar19;
  undefined1 auVar20 [16];
  _Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2f8;
  atomic<int> *totalNodes_local;
  Allocator alloc_local;
  atomic<int> orderedPrimsOffset;
  pointer pMStack_2b0;
  pointer local_2a8;
  _Any_data local_298;
  code *pcStack_288;
  code *pcStack_280;
  _Any_data local_278;
  code *pcStack_268;
  code *pcStack_260;
  pointer local_258;
  pointer pLStack_250;
  pointer local_248;
  int iStack_23c;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  
  auVar20._8_4_ = 0xff7fffff;
  auVar20._0_8_ = 0xff7fffffff7fffff;
  auVar20._12_4_ = 0xff7fffff;
  local_258 = (pointer)0x7f7fffff7f7fffff;
  pLStack_250 = (pointer)0xff7fffff7f7fffff;
  local_248 = (pointer)vmovlps_avx(auVar20);
  pBVar2 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  totalNodes_local = totalNodes;
  alloc_local.memoryResource = alloc.memoryResource;
  for (pBVar19 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar2; pBVar19 = pBVar19 + 1)
  {
    Union<float>((Bounds3<float> *)&treeletsToBuild,(Bounds3<float> *)&local_258,&pBVar19->centroid)
    ;
    local_258 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_start;
    pLStack_250 = treeletsToBuild.
                  super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_248 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  }
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)&local_2f8,
             ((long)(bvhPrimitives->
                    super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,
             (allocator_type *)&treeletsToBuild);
  pBVar19 = (bvhPrimitives->
            super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pBVar2 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  pcStack_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278._M_unused._M_object = operator_new(0x18);
  *(_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)
   local_278._M_unused._0_8_ = &local_2f8;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)
   ((long)local_278._M_unused._0_8_ + 8) = bvhPrimitives;
  *(Bounds3<float> **)((long)local_278._M_unused._0_8_ + 0x10) = (Bounds3<float> *)&local_258;
  pcStack_260 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp:406:42)>
                ::_M_invoke;
  pcStack_268 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp:406:42)>
                ::_M_manager;
  ParallelFor(0,((long)pBVar2 - (long)pBVar19) / 0x30,(function<void_(long)> *)&local_278);
  std::_Function_base::~_Function_base((_Function_base *)&local_278);
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             &orderedPrimsOffset,
             (long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f8._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&treeletsToBuild);
  pMVar6 = local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage;
  pMVar5 = local_2f8._M_impl.super__Vector_impl_data._M_finish;
  pMVar4 = local_2f8._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppMVar12 = &pMStack_2b0;
    p_Var15 = (_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
              &orderedPrimsOffset;
    if ((uVar8 & 1) == 0) {
      ppMVar12 = &local_2f8._M_impl.super__Vector_impl_data._M_finish;
      p_Var15 = &local_2f8;
    }
    pMVar3 = *ppMVar12;
    pMVar11 = (((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)p_Var15)->
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (pMVar14 = pMVar11; pMVar14 != pMVar3; pMVar14 = pMVar14 + 1) {
      piVar1 = (int *)((long)&treeletsToBuild.
                              super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (ulong)(pMVar14->mortonCode >> (uVar8 * 6 & 0x1f) & 0x3f) * 4);
      *piVar1 = *piVar1 + 1;
    }
    finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)finishedTreelets.
                          super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar13 = 0;
    for (lVar16 = 1; lVar16 != 0x40; lVar16 = lVar16 + 1) {
      iVar13 = iVar13 + (&iStack_23c)[lVar16];
      *(int *)((long)&finishedTreelets.
                      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 * 4) = iVar13;
    }
    for (; pMVar11 != pMVar3; pMVar11 = pMVar11 + 1) {
      uVar17 = (ulong)(pMVar11->mortonCode >> (uVar8 * 6 & 0x1f) & 0x3f);
      iVar13 = *(int *)((long)&finishedTreelets.
                               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar17 * 4);
      *(int *)((long)&finishedTreelets.
                      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17 * 4) = iVar13 + 1;
      p_Var15 = &local_2f8;
      if ((uVar8 & 1) == 0) {
        p_Var15 = (_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
                  &orderedPrimsOffset;
      }
      (((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)p_Var15)->
      super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>)._M_impl.
      super__Vector_impl_data._M_start[iVar13] = *pMVar11;
    }
  }
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = local_2a8;
  local_2f8._M_impl.super__Vector_impl_data._M_start = _orderedPrimsOffset;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = pMStack_2b0;
  _orderedPrimsOffset = pMVar4;
  pMStack_2b0 = pMVar5;
  local_2a8 = pMVar6;
  std::_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~_Vector_base
            ((_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             &orderedPrimsOffset);
  iVar18 = 0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar13 = 1;
  for (uVar17 = 1;
      pLVar10 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_finish,
      pLVar7 = treeletsToBuild.
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_start,
      (long)uVar17 <=
      (long)(int)((ulong)((long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2f8._M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar17 = uVar17 + 1) {
    if ((uVar17 == ((ulong)((long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2f8._M_impl.super__Vector_impl_data._M_start) >> 3 &
                   0xffffffff)) ||
       (((local_2f8._M_impl.super__Vector_impl_data._M_start[uVar17].mortonCode ^
         local_2f8._M_impl.super__Vector_impl_data._M_start[iVar18].mortonCode) & 0x3ffc0000) != 0))
    {
      finishedTreelets.
      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::BVHBuildNode>
                              (&alloc_local,(long)(iVar13 + iVar18 * -2));
      finishedTreelets.
      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44((int)uVar17 - iVar18,iVar18);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::
      emplace_back<pbrt::LBVHTreelet>(&treeletsToBuild,(LBVHTreelet *)&finishedTreelets);
      iVar18 = (int)uVar17;
    }
    iVar13 = iVar13 + 2;
  }
  _orderedPrimsOffset = (pointer)((ulong)_orderedPrimsOffset & 0xffffffff00000000);
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  pcStack_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = operator_new(0x38);
  *(vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> **)local_298._M_unused._0_8_ =
       &treeletsToBuild;
  *(BVHAggregate **)((long)local_298._M_unused._0_8_ + 8) = this;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)
   ((long)local_298._M_unused._0_8_ + 0x10) = bvhPrimitives;
  *(_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)
   ((long)local_298._M_unused._0_8_ + 0x18) = &local_2f8;
  *(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> **)
   ((long)local_298._M_unused._0_8_ + 0x20) = orderedPrims;
  *(atomic<int> **)((long)local_298._M_unused._0_8_ + 0x28) = &orderedPrimsOffset;
  *(atomic<int> ***)((long)local_298._M_unused._0_8_ + 0x30) = &totalNodes_local;
  pcStack_280 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp:438:44)>
                ::_M_invoke;
  pcStack_288 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp:438:44)>
                ::_M_manager;
  ParallelFor(0,(long)pLVar10 - (long)pLVar7 >> 4,(function<void_(long)> *)&local_298);
  std::_Function_base::~_Function_base((_Function_base *)&local_298);
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
            (&finishedTreelets,
             (long)treeletsToBuild.
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)treeletsToBuild.
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4);
  pLVar7 = treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar10 = treeletsToBuild.
                 super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                 super__Vector_impl_data._M_start; pLVar10 != pLVar7; pLVar10 = pLVar10 + 1) {
    std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::push_back
              (&finishedTreelets,&pLVar10->buildNodes);
  }
  pBVar9 = buildUpperSAH(this,alloc_local,&finishedTreelets,0,
                         (int)((ulong)((long)finishedTreelets.
                                             super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)finishedTreelets.
                                            super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),
                         totalNodes_local);
  std::_Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::~_Vector_base
            (&finishedTreelets.
              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>);
  std::_Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::~_Vector_base
            (&treeletsToBuild.
              super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>);
  std::_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~_Vector_base
            (&local_2f8);
  return pBVar9;
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<PrimitiveHandle> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &pi : bvhPrimitives)
        bounds = Union(bounds, pi.centroid);

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].centroid);
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (int start = 0, end = 1; end <= (int)mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            int nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}